

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall tf::Node::_precede(Node *this,Node *v)

{
  reference __a;
  SmallVectorTemplateCommon<tf::Node_*,_void> *this_00;
  reference __b;
  long in_RDI;
  Node **in_stack_ffffffffffffffc8;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_stack_ffffffffffffffd0;
  
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
  __a = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                  (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8);
  this_00 = (SmallVectorTemplateCommon<tf::Node_*,_void> *)(in_RDI + 0x48);
  SmallVectorTemplateCommon<tf::Node_*,_void>::size(this_00);
  __b = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                  (this_00,(size_type)in_stack_ffffffffffffffc8);
  std::swap<tf::Node*>(__a,__b);
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)this_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

inline void Node::_precede(Node* v) {
  _edges.push_back(v);
  std::swap(_edges[_num_successors++], _edges[_edges.size() - 1]);
  v->_edges.push_back(this);
}